

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageLayout.cpp
# Opt level: O0

void __thiscall KDReports::Test::testPageBreak(Test *this)

{
  byte bVar1;
  int iVar2;
  QColor local_100;
  QString local_f0;
  TextElement local_d8 [28];
  undefined4 local_bc;
  QColor local_b8;
  QString local_a8;
  TextElement local_90 [28];
  QColor local_74;
  QString local_58;
  TextElement local_40 [24];
  Report local_28 [8];
  Report report;
  Test *this_local;
  
  KDReports::Report::Report(local_28,(QObject *)0x0);
  QString::QString(&local_58,"First page");
  KDReports::TextElement::TextElement(local_40,(QString *)&local_58);
  QColor::QColor(&local_74);
  KDReports::Report::addElement(local_28,local_40,1,&local_74);
  KDReports::TextElement::~TextElement(local_40);
  QString::~QString(&local_58);
  KDReports::Report::addPageBreak();
  QString::QString(&local_a8,"Second page");
  KDReports::TextElement::TextElement(local_90,(QString *)&local_a8);
  QColor::QColor(&local_b8);
  KDReports::Report::addElement(local_28,local_90,1,&local_b8);
  KDReports::TextElement::~TextElement(local_90);
  QString::~QString(&local_a8);
  iVar2 = KDReports::Report::numberOfPages();
  bVar1 = QTest::qCompare(iVar2,2,"report.numberOfPages()","2",
                          "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/PageLayout/PageLayout.cpp"
                          ,0x2f);
  if ((bVar1 & 1) == 0) {
    local_bc = 1;
  }
  else {
    KDReports::Report::addPageBreak();
    iVar2 = KDReports::Report::numberOfPages();
    bVar1 = QTest::qCompare(iVar2,3,"report.numberOfPages()","3",
                            "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/PageLayout/PageLayout.cpp"
                            ,0x31);
    if ((bVar1 & 1) == 0) {
      local_bc = 1;
    }
    else {
      KDReports::Report::addPageBreak();
      iVar2 = KDReports::Report::numberOfPages();
      bVar1 = QTest::qCompare(iVar2,3,"report.numberOfPages()","3",
                              "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/PageLayout/PageLayout.cpp"
                              ,0x33);
      if ((bVar1 & 1) == 0) {
        local_bc = 1;
      }
      else {
        QString::QString(&local_f0);
        KDReports::TextElement::TextElement(local_d8,(QString *)&local_f0);
        QColor::QColor(&local_100);
        KDReports::Report::addElement(local_28,local_d8,1,&local_100);
        KDReports::TextElement::~TextElement(local_d8);
        QString::~QString(&local_f0);
        KDReports::Report::addPageBreak();
        iVar2 = KDReports::Report::numberOfPages();
        bVar1 = QTest::qCompare(iVar2,4,"report.numberOfPages()","4",
                                "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/PageLayout/PageLayout.cpp"
                                ,0x36);
        if ((bVar1 & 1) == 0) {
          local_bc = 1;
        }
        else {
          local_bc = 0;
        }
      }
    }
  }
  KDReports::Report::~Report(local_28);
  return;
}

Assistant:

void testPageBreak()
    {
        Report report;
        report.addElement(KDReports::TextElement("First page"));
        report.addPageBreak();
        report.addElement(KDReports::TextElement("Second page"));
        QCOMPARE(report.numberOfPages(), 2);
        report.addPageBreak();
        QCOMPARE(report.numberOfPages(), 3);
        report.addPageBreak();
        QCOMPARE(report.numberOfPages(), 3); // yep, it's a flag, can only be set once; documented.
        report.addElement(KDReports::TextElement(QString()));
        report.addPageBreak();
        QCOMPARE(report.numberOfPages(), 4);
    }